

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O3

void __thiscall QtMWidgets::TextLabel::TextLabel(TextLabel *this,QWidget *parent,WindowFlags f)

{
  TextLabelPrivate *this_00;
  
  QFrame::QFrame();
  *(undefined ***)this = &PTR_metaObject_00193af8;
  *(undefined ***)&this->field_0x10 = &PTR__TextLabel_00193cb0;
  this_00 = (TextLabelPrivate *)operator_new(0x28);
  this_00->q = this;
  QStaticText::QStaticText(&this_00->staticText);
  this_00->margin = 0;
  (this_00->color).cspec = Invalid;
  (this_00->color).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->color).ct + 2) = 0;
  (this->d).d = this_00;
  TextLabelPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

TextLabel::TextLabel( QWidget * parent, Qt::WindowFlags f )
	:	QFrame( parent, f )
	,	d( new TextLabelPrivate( this ) )
{
	d->init();
}